

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerPool.cpp
# Opt level: O2

PoolHandle __thiscall TimerPool::Create(TimerPool *this,string *name)

{
  _Impl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PoolHandle PVar3;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::EnableConstructor<TimerPool>,_std::allocator<(anonymous_namespace)::EnableConstructor<TimerPool>_>,_(__gnu_cxx::_Lock_policy)2>_>
  local_49;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::EnableConstructor<TimerPool>,_std::allocator<(anonymous_namespace)::EnableConstructor<TimerPool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_48;
  _Impl *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  p_Var2 = (pointer)operator_new(0xb8);
  local_48._M_alloc = &local_49;
  (((enable_shared_from_this<TimerPool> *)
   &(p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count)->_M_weak_this).
  super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x100000001;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00109b68;
  this_00 = &p_Var2->_M_impl;
  local_48._M_ptr = p_Var2;
  TimerPool((TimerPool *)this_00,name);
  local_48._M_ptr = (pointer)0x0;
  (p_Var2->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__TimerPool_00109bb8;
  local_38 = this_00;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::EnableConstructor<TimerPool>,_std::allocator<(anonymous_namespace)::EnableConstructor<TimerPool>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_48);
  std::__weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>::_M_assign
            ((__weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8),(TimerPool *)this_00,a_Stack_30);
  _Var1._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_TimerPool = (_func_int **)local_38;
  (this->super_enable_shared_from_this<TimerPool>)._M_weak_this.
  super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
  local_38 = (_Impl *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  PVar3.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PoolHandle)PVar3.super___shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerPool::PoolHandle TimerPool::Create(const std::string& name)
{
    return std::make_shared<EnableConstructor<TimerPool>>(name);
}